

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O2

void __thiscall LCA_BenchmarkN100000Q100000_Test::TestBody(LCA_BenchmarkN100000Q100000_Test *this)

{
  int iVar1;
  bool bVar2;
  
  srand(1);
  iVar1 = 100000;
  generateTree(100000);
  initLCA(0,100000);
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    rand();
    rand();
  }
  return;
}

Assistant:

TEST(LCA, BenchmarkN100000Q100000) {
    srand(1);
    int n = 100000;
    int q = 100000;
    generateTree(n);
    initLCA(0, n);
    rep(i, 0, q) {
        lca(rand() % n, rand() % n);
    }
}